

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_serialize_field
          (t_dart_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  int iVar2;
  t_type *ttype;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  t_struct *tstruct;
  t_dart_generator *this_00;
  char *pcVar5;
  t_base_type *this_01;
  undefined1 auVar6 [12];
  string name;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  this_00 = (t_dart_generator *)&tfield->name_;
  std::__cxx11::string::string((string *)&local_50,(string *)this_00);
  get_member_name(&field_name,this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
    if (((char)iVar2 == '\0') &&
       (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 == '\0')) {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar2 == '\0')) {
          pcVar1 = (prefix->_M_dataplus)._M_p;
          type_name_abi_cxx11_(&name,this,ttype);
          pbVar4 = &name;
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,
                 field_name._M_dataplus._M_p,name._M_dataplus._M_p);
        }
        else {
          std::operator+(&name,prefix,&field_name);
          poVar3 = t_generator::indent((t_generator *)this,out);
          std::operator<<(poVar3,"oprot.");
          iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
          if ((char)iVar2 == '\0') {
            iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
            if ((char)iVar2 != '\0') {
              poVar3 = std::operator<<(out,"writeI32(");
              poVar3 = std::operator<<(poVar3,(string *)&name);
              std::operator<<(poVar3,");");
            }
          }
          else {
            this_01 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
            switch(this_01) {
            case (t_base_type *)0x0:
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                             &name);
              __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case (t_base_type *)0x1:
              iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
              pcVar5 = "writeString(";
              if ((char)iVar2 != '\0') {
                pcVar5 = "writeBinary(";
              }
              break;
            case (t_base_type *)0x2:
              pcVar5 = "writeBool(";
              break;
            case (t_base_type *)0x3:
              pcVar5 = "writeByte(";
              break;
            case (t_base_type *)0x4:
              pcVar5 = "writeI16(";
              break;
            case (t_base_type *)0x5:
              pcVar5 = "writeI32(";
              break;
            case (t_base_type *)0x6:
              pcVar5 = "writeI64(";
              break;
            case (t_base_type *)0x7:
              pcVar5 = "writeDouble(";
              break;
            default:
              auVar6 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_(&local_70,this_01,auVar6._8_4_);
              std::operator+(auVar6._0_8_,"compiler error: no Dart name for base type ",&local_70);
              __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                         );
            }
            poVar3 = std::operator<<(out,pcVar5);
            poVar3 = std::operator<<(poVar3,(string *)&name);
            std::operator<<(poVar3,");");
          }
          std::operator<<(out,(string *)&::endl_abi_cxx11_);
          pbVar4 = &name;
        }
      }
      else {
        std::operator+(&local_b0,prefix,&field_name);
        generate_serialize_container(this,out,ttype,&local_b0);
        pbVar4 = &local_b0;
      }
    }
    else {
      std::operator+(&local_90,prefix,&field_name);
      generate_serialize_struct(this,out,tstruct,&local_90);
      pbVar4 = &local_90;
    }
    std::__cxx11::string::~string((string *)pbVar4);
    std::__cxx11::string::~string((string *)&field_name);
    return;
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&name,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  std::operator+(pbVar4,&name,&field_name);
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_dart_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());
  string field_name = get_member_name(tfield->get_name());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + field_name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + field_name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + field_name);
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + field_name;
    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no Dart name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           field_name.c_str(),
           type_name(type).c_str());
  }
}